

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void test_remove_many(void)

{
  sbs_t *sbs_00;
  uint32_t v;
  sbs_t *sbs_3;
  uint32_t values_2 [2];
  sbs_t *sbs_2;
  uint32_t values_1 [8];
  sbs_t *sbs_1;
  uint32_t values [8];
  sbs_t *sbs;
  uint32_t in_stack_ffffffffffffff8c;
  uint line;
  sbs_t *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  char *expression;
  sbs_t *in_stack_ffffffffffffffa0;
  sbs_t *in_stack_ffffffffffffffc0;
  sbs_t *psVar1;
  
  sbs_create();
  sbs_add_range(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                (uint64_t)in_stack_ffffffffffffff90);
  sbs_remove_many(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                  (uint32_t *)in_stack_ffffffffffffff90);
  sbs_compare(in_stack_ffffffffffffffc0);
  sbs_free((sbs_t *)0x115259);
  sbs_create();
  sbs_add_range(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                (uint64_t)in_stack_ffffffffffffff90);
  psVar1 = (sbs_t *)0x300010003;
  sbs_remove_many(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                  (uint32_t *)in_stack_ffffffffffffff90);
  sbs_compare(psVar1);
  sbs_free((sbs_t *)0x1152ce);
  sbs_00 = sbs_create();
  sbs_add_value(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  expression = (char *)0x13880000001f5;
  sbs_remove_many(sbs_00,0x13880000001f5,(uint32_t *)in_stack_ffffffffffffff90);
  sbs_remove_many(sbs_00,(size_t)expression,(uint32_t *)in_stack_ffffffffffffff90);
  sbs_compare(psVar1);
  sbs_free((sbs_t *)0x11532c);
  psVar1 = sbs_create();
  sbs_add_range(sbs_00,(uint64_t)expression,(uint64_t)psVar1);
  for (line = 0; line < 0x10000; line = line + 1) {
    sbs_remove_many(sbs_00,(size_t)expression,(uint32_t *)psVar1);
    roaring_bitmap_get_cardinality((roaring_bitmap_t *)sbs_00);
    _assert_true((unsigned_long)sbs_00,expression,(char *)psVar1,line);
  }
  sbs_is_empty(psVar1);
  _assert_true((unsigned_long)sbs_00,expression,(char *)psVar1,line);
  sbs_free((sbs_t *)0x1153ed);
  return;
}

Assistant:

DEFINE_TEST(test_remove_many) {
    // multiple values per container (sorted)
    {
        sbs_t *sbs = sbs_create();
        sbs_add_range(sbs, 0, 65536 * 2 - 1);
        uint32_t values[] = {1,         3,         5,         7,
                             65536 + 1, 65536 + 3, 65536 + 5, 65536 + 7};
        sbs_remove_many(sbs, sizeof(values) / sizeof(values[0]), values);
        sbs_compare(sbs);
        sbs_free(sbs);
    }

    // multiple values per container (interleaved)
    {
        sbs_t *sbs = sbs_create();
        sbs_add_range(sbs, 0, 65536 * 2 - 1);
        uint32_t values[] = {65536 + 7, 65536 + 5, 7,         5,
                             1,         65536 + 1, 65536 + 3, 3};
        sbs_remove_many(sbs, sizeof(values) / sizeof(values[0]), values);
        sbs_compare(sbs);
        sbs_free(sbs);
    }

    // no-op checks
    {
        sbs_t *sbs = sbs_create();
        sbs_add_value(sbs, 500);
        uint32_t values[] = {501, 80000};  // non-existent value/container
        sbs_remove_many(sbs, sizeof(values) / sizeof(values[0]), values);
        sbs_remove_many(sbs, 0, NULL);  // NULL ptr is not dereferenced
        sbs_compare(sbs);
        sbs_free(sbs);
    }

    // container type changes and container removal
    {
        sbs_t *sbs = sbs_create();
        sbs_add_range(sbs, 0, 65535);
        for (uint32_t v = 0; v <= 65535; v++) {
            sbs_remove_many(sbs, 1, &v);
            assert_true(roaring_bitmap_get_cardinality(sbs->roaring) ==
                        65535 - v);
        }
        assert_true(sbs_is_empty(sbs));
        sbs_free(sbs);
    }
}